

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O0

void __thiscall WorkItemScheduler::WorkItemScheduler(WorkItemScheduler *this,size_t workers_nb)

{
  int aiVar1 [2];
  int iVar2;
  system_error *psVar3;
  errc *peVar4;
  reference this_00;
  int (*paiVar5) [2];
  error_code eVar6;
  error_code __ec;
  error_code __ec_00;
  undefined1 local_6c [8];
  epoll_event ev;
  int local_50;
  int local_4c;
  int socketfds [2];
  size_t i;
  allocator<Worker> local_19;
  int local_18 [2];
  size_t workers_nb_local;
  WorkItemScheduler *this_local;
  
  local_18 = (int  [2])workers_nb;
  workers_nb_local = (size_t)this;
  std::allocator<Worker>::allocator(&local_19);
  std::vector<Worker,_std::allocator<Worker>_>::vector(&this->workers_,workers_nb,&local_19);
  std::allocator<Worker>::~allocator(&local_19);
  std::
  deque<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ::deque(&this->work_);
  std::thread::thread(&this->dispatcher_thread_);
  this->epoll_fd_ = -1;
  this->active_ = false;
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map(&this->fd_worker_map_);
  iVar2 = epoll_create1(0);
  this->epoll_fd_ = iVar2;
  if (this->epoll_fd_ == -1) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    peVar4 = (errc *)__errno_location();
    eVar6 = std::make_error_code(*peVar4);
    __ec._M_cat = eVar6._M_cat;
    __ec._4_4_ = 0;
    __ec._M_value = eVar6._M_value;
    std::system_error::system_error(psVar3,__ec,"Call to epoll_create1(2) failed");
    __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  socketfds[0] = 0;
  socketfds[1] = 0;
  while( true ) {
    if ((ulong)local_18 <= (ulong)socketfds) {
      return;
    }
    memset(&local_50,0,8);
    iVar2 = socketpair(1,5,0,&local_50);
    if (iVar2 == -1) break;
    memset(local_6c,0,0xc);
    local_6c._0_4_ = 1;
    local_6c._4_4_ = local_50;
    iVar2 = epoll_ctl(this->epoll_fd_,1,local_50,(epoll_event *)local_6c);
    if (iVar2 == -1) {
      close(local_50);
      close(local_4c);
      psVar3 = (system_error *)__cxa_allocate_exception(0x20);
      peVar4 = (errc *)__errno_location();
      eVar6 = std::make_error_code(*peVar4);
      __ec_00._M_cat = eVar6._M_cat;
      __ec_00._4_4_ = 0;
      __ec_00._M_value = eVar6._M_value;
      std::system_error::system_error(psVar3,__ec_00,"Call to epoll_ctl(2) failed");
      __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    this_00 = std::vector<Worker,_std::allocator<Worker>_>::operator[]
                        (&this->workers_,(size_type)socketfds);
    Worker::set_socketfd(this_00,local_4c);
    aiVar1 = socketfds;
    paiVar5 = (int (*) [2])
              std::
              map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
              ::operator[](&this->fd_worker_map_,&local_50);
    *paiVar5 = aiVar1;
    socketfds = (int  [2])((long)socketfds + 1);
  }
  psVar3 = (system_error *)__cxa_allocate_exception(0x20);
  peVar4 = (errc *)__errno_location();
  eVar6 = std::make_error_code(*peVar4);
  ev.data.fd = eVar6._M_value;
  eVar6._4_4_ = 0;
  eVar6._M_value = ev.data.fd;
  std::system_error::system_error(psVar3,eVar6,"Call to socketpair(2) failed");
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

WorkItemScheduler::WorkItemScheduler(size_t workers_nb)
    : workers_(workers_nb)
{
    this->epoll_fd_ = epoll_create1(0);
    if (this->epoll_fd_ == -1)
        throw SYS_ERROR(errno, "Call to epoll_create1(2) failed");

    for (size_t i = 0; i < workers_nb; ++i)
    {
        int socketfds[2] = {0};
        if (socketpair(AF_UNIX, SOCK_SEQPACKET, 0, socketfds) == -1)
            throw SYS_ERROR(errno, "Call to socketpair(2) failed");

        struct epoll_event ev = {0};
        ev.events = EPOLLIN;
        ev.data.fd = socketfds[0];

        if (epoll_ctl(this->epoll_fd_, EPOLL_CTL_ADD, socketfds[0], &ev) == -1)
        {
            close(socketfds[0]);
            close(socketfds[1]);
            throw SYS_ERROR(errno, "Call to epoll_ctl(2) failed");
        }

        this->workers_[i].set_socketfd(socketfds[1]);
        this->fd_worker_map_[socketfds[0]] = i;
    }
}